

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O3

bool __thiscall SQClass::Get(SQClass *this,SQObjectPtr *key,SQObjectPtr *val)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQClassMember *pSVar4;
  bool bVar5;
  uint uVar6;
  SQObjectType SVar7;
  ulong uVar8;
  SQObjectType *pSVar9;
  SQObjectType *pSVar10;
  SQTable *pSVar11;
  
  bVar5 = SQTable::Get(this->_members,key,val);
  if (bVar5) {
    pSVar3 = (val->super_SQObject)._unVal.pTable;
    uVar6 = (uint)pSVar3 & 0xffffff;
    if (((uint)pSVar3 >> 0x19 & 1) == 0) {
      pSVar4 = (this->_methods)._vals;
      uVar8 = (ulong)(uVar6 << 5);
      SVar2 = (val->super_SQObject)._type;
      pSVar11 = *(SQTable **)((long)&(pSVar4->val).super_SQObject._unVal + uVar8);
      (val->super_SQObject)._unVal.pTable = pSVar11;
      SVar7 = *(SQObjectType *)((long)&(pSVar4->val).super_SQObject._type + uVar8);
    }
    else {
      pSVar9 = (SQObjectType *)
               ((long)&(((this->_defaultvalues)._vals)->val).super_SQObject._type +
               (ulong)(uVar6 << 5));
      pSVar10 = pSVar9 + 2;
      SVar7 = *pSVar9;
      if (SVar7 == OT_WEAKREF) {
        SVar7 = *(SQObjectType *)(*(undefined8 *)pSVar10 + 0x18);
        pSVar10 = (SQObjectType *)(*(undefined8 *)pSVar10 + 0x20);
      }
      pSVar11 = *(SQTable **)pSVar10;
      SVar2 = (val->super_SQObject)._type;
      (val->super_SQObject)._unVal.pWeakRef = (SQWeakRef *)pSVar11;
    }
    (val->super_SQObject)._type = SVar7;
    if ((SVar7 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar11->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  return bVar5;
}

Assistant:

bool Get(const SQObjectPtr &key,SQObjectPtr &val) {
        if(_members->Get(key,val)) {
            if(_isfield(val)) {
                SQObjectPtr &o = _defaultvalues[_member_idx(val)].val;
                val = _realval(o);
            }
            else {
                val = _methods[_member_idx(val)].val;
            }
            return true;
        }
        return false;
    }